

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O2

void __thiscall
anurbs::
TypeEntry<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>,_anurbs::Model>::
~TypeEntry(TypeEntry<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>,_anurbs::Model>
           *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

bool load(TModel& model, const Json& source) override
    {
        const auto key = key_from_json(source);

        Pointer<TData> data = TData::load(model, source);

        Ref<TData> ref;

        if (key.empty()) {
            ref = model.template add<TData>(data);
        } else {
            ref = model.template add<TData>(key, data);
        }

        ref.attributes()->load(model, source);

        return true;
    }